

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

ssize_t zt_cstr_rfind(char *s,ssize_t i,ssize_t j,char *str)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  char *in_RCX;
  char *in_RDI;
  ssize_t t;
  size_t len_1;
  ssize_t offt;
  size_t len;
  size_t in_stack_ffffffffffffffb8;
  long local_38;
  ssize_t local_20;
  long local_18;
  
  sVar2 = strlen(in_RDI);
  if (sVar2 == 0) {
    local_18 = 0;
    local_20 = 0;
  }
  else {
    local_18 = IDX(sVar2,in_stack_ffffffffffffffb8);
    sVar3 = IDX(sVar2,in_stack_ffffffffffffffb8);
    local_20 = sVar3;
    if (sVar3 < local_18) {
      local_20 = local_18;
      local_18 = sVar3;
    }
  }
  sVar2 = strlen(in_RCX);
  if (sVar2 != 0) {
    if (sVar2 == 1) {
      for (; local_18 <= local_20; local_20 = local_20 + -1) {
        if (in_RDI[local_20] == *in_RCX) {
          return local_20;
        }
      }
    }
    for (local_38 = (local_20 - sVar2) + 1; local_18 <= local_38; local_38 = local_38 + -1) {
      iVar1 = strncmp(in_RDI + local_38,in_RCX,sVar2);
      if (iVar1 == 0) {
        return local_38;
      }
    }
  }
  return -1;
}

Assistant:

ssize_t
zt_cstr_rfind(const char *s, ssize_t i, ssize_t j, const char *str) {
    size_t    len;
    ssize_t   offt;

    zt_assert(str);

    CONVERT(s, i, j);
    len = strlen(str);

    if (len == 0) {
        return -1;
    }

    if (len == 1) {
        for (; j >= i; j--) {
            if (s[j] == *str) {
                return j;
            }
        }
    }

    for (offt = j - len + 1; offt >= i; offt--) {
        if (strncmp(&s[offt], str, len) == 0) {
            return offt;
        }
    }

    return -1;
}